

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

Promise<void> kj::yieldUntilWouldSleep(void)

{
  int iVar1;
  PromiseBase in_RDI;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_18 [2];
  
  if (yieldUntilWouldSleep()::NODE == '\0') {
    iVar1 = __cxa_guard_acquire(&yieldUntilWouldSleep()::NODE);
    if (iVar1 != 0) {
      __cxa_atexit(yieldUntilWouldSleep::YieldUntilWouldSleepPromiseNode::
                   ~YieldUntilWouldSleepPromiseNode,&yieldUntilWouldSleep::NODE,&__dso_handle);
      __cxa_guard_release(&yieldUntilWouldSleep()::NODE);
    }
  }
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::Own
            (local_18,&yieldUntilWouldSleep::NODE.super_PromiseNode);
  _::PromiseNode::to<kj::Promise<void>>((PromiseNode *)in_RDI.node.ptr,local_18);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::~Own(local_18);
  return (Promise<void>)(PromiseNode *)in_RDI.node.ptr;
}

Assistant:

Promise<void> yieldUntilWouldSleep() {
  class YieldUntilWouldSleepPromiseNode final: public _::PromiseNode {
  public:
    void destroy() override {}

    void onReady(_::Event* event) noexcept override {
      if (event) event->armWhenWouldSleep();
    }
    void get(_::ExceptionOrValue& output) noexcept override {
      output.as<_::Void>() = _::Void();
    }
    void tracePromise(_::TraceBuilder& builder, bool stopAtNextEvent) override {
      builder.add(reinterpret_cast<void*>(&kj::yieldUntilWouldSleep));
    }
  };

  static YieldUntilWouldSleepPromiseNode NODE;
  return _::PromiseNode::to<Promise<void>>(_::OwnPromiseNode(&NODE));
}